

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::VerilogModule::verilog_src_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,VerilogModule *this,SystemVerilogCodeGenOptions *options)

{
  kratos *this_00;
  pointer pcVar1;
  SystemVerilogCodeGenOptions *in_RCX;
  undefined1 local_88 [8];
  pointer local_80;
  undefined1 local_70 [24];
  undefined8 *local_58 [2];
  undefined8 local_48 [2];
  undefined1 local_38;
  
  this_00 = *(kratos **)this;
  local_88[0] = options->unique_case;
  local_88[1] = options->yosys_src;
  pcVar1 = (options->package_name)._M_dataplus._M_p;
  local_80 = (pointer)local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (options->package_name)._M_string_length);
  local_70._16_8_ = options->line_wrap;
  pcVar1 = (options->output_dir)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + (options->output_dir)._M_string_length);
  local_38 = options->extract_debug_info;
  generate_verilog_abi_cxx11_(__return_storage_ptr__,this_00,(Generator *)local_88,in_RCX);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_80 != (pointer)local_70) {
    operator_delete(local_80,(ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_70._0_8_)->_M_dataplus)._M_p + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> VerilogModule::verilog_src(SystemVerilogCodeGenOptions options) {
    return generate_verilog(generator_, options);
}